

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int24_To_Int32(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                   int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  uchar *src;
  byte *pbVar1;
  PaInt32 *dest;
  bool bVar2;
  
  pbVar1 = (byte *)((long)sourceBuffer + 2);
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    *(uint *)destinationBuffer = (uint)*pbVar1 << 0x18 | (uint)*(ushort *)(pbVar1 + -2) << 8;
    pbVar1 = pbVar1 + sourceStride * 3;
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
  }
  return;
}

Assistant:

static void Int24_To_Int32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src  = (unsigned char*)sourceBuffer;
    PaInt32 *dest = (PaInt32*)  destinationBuffer;
    PaInt32 temp;

    (void) ditherGenerator; /* unused parameter */
    
    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        temp = (((PaInt32)src[0]) << 8);  
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 24);
#elif defined(PA_BIG_ENDIAN)
        temp = (((PaInt32)src[0]) << 24);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 8);
#endif

        *dest = temp;

        src += sourceStride * 3;
        dest += destinationStride;
    }
}